

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O0

float xm_frequency(xm_context_t *ctx,float period,float note_offset,float period_offset)

{
  long in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float in_XMM1_Da;
  float in_XMM2_Da;
  uint8_t i;
  int32_t p2;
  int32_t p1;
  float note;
  int8_t octave;
  uint8_t a;
  byte local_2d;
  uint32_t local_2c;
  uint32_t local_28;
  byte local_1e;
  byte local_1d;
  float local_4;
  
  if (*(int *)(in_RDI + 0x14) == 0) {
    local_4 = xm_linear_frequency(0.0);
  }
  else if (*(int *)(in_RDI + 0x14) == 1) {
    if ((in_XMM1_Da != 0.0) || (NAN(in_XMM1_Da))) {
      local_1e = 0;
      local_1d = 0;
      fVar1 = in_XMM0_Da * 1024.0;
      if (fVar1 <= 1753088.0) {
        if (fVar1 < 876544.0) {
          local_1e = 1;
          while (fVar1 < (float)(0xd6000 >> (local_1e & 0x1f))) {
            local_1e = local_1e + 1;
          }
        }
      }
      else {
        local_1e = 0xff;
        while ((float)(uint)(0x1ac000 << (-local_1e & 0x1f)) < fVar1) {
          local_1e = local_1e - 1;
        }
      }
      for (local_2d = 0; local_2d < 0xc; local_2d = local_2d + 1) {
        local_28 = amiga_frequencies[local_2d];
        local_2c = amiga_frequencies[(int)(local_2d + 1)];
        if ((char)local_1e < '\x01') {
          if ((char)local_1e < '\0') {
            local_28 = local_28 << (-local_1e & 0x1f);
            local_2c = local_2c << (-local_1e & 0x1f);
          }
        }
        else {
          local_28 = (int)local_28 >> (local_1e & 0x1f);
          local_2c = (int)local_2c >> (local_1e & 0x1f);
        }
        if (((float)(int)local_2c <= fVar1) && (fVar1 <= (float)(int)local_28)) {
          local_1d = local_2d;
          break;
        }
      }
      if (((float)(int)local_28 < fVar1) || (fVar1 < (float)(int)local_2c)) {
        fprintf(_stderr,"%s(): %d <= %f <= %d should hold but doesn\'t, this is a bug\n",
                (double)fVar1,"xm_frequency",(ulong)local_2c,(ulong)local_28);
        fflush(_stderr);
      }
      fVar1 = xm_amiga_period((float)((char)local_1e + 2) * 12.0 + (float)local_1d +
                              (fVar1 - (float)(int)local_28) / (float)(int)(local_2c - local_28) +
                              in_XMM1_Da);
      local_4 = xm_amiga_frequency(in_XMM2_Da * 16.0 + fVar1);
    }
    else {
      local_4 = xm_amiga_frequency(in_XMM2_Da * 16.0 + in_XMM0_Da);
    }
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

static float xm_frequency(xm_context_t* ctx, float period, float note_offset, float period_offset) {
	uint8_t a;
	int8_t octave;
	float note;
	int32_t p1, p2;

	switch(ctx->module.frequency_type) {

	case XM_LINEAR_FREQUENCIES:
		return xm_linear_frequency(period - 64.f * note_offset - 16.f * period_offset);

	case XM_AMIGA_FREQUENCIES:
		if(note_offset == 0) {
			/* A chance to escape from insanity */
			return xm_amiga_frequency(period + 16.f * period_offset);
		}

		/* FIXME: this is very crappy at best */
		a = octave = 0;

		/* Find the octave of the current period */
		period *= AMIGA_FREQ_SCALE;
		if(period > amiga_frequencies[0]) {
			--octave;
			while(period > (amiga_frequencies[0] << (-octave))) --octave;
		} else if(period < amiga_frequencies[12]) {
			++octave;
			while(period < (amiga_frequencies[12] >> octave)) ++octave;
		}

		/* Find the smallest note closest to the current period */
		for(uint8_t i = 0; i < 12; ++i) {
			p1 = amiga_frequencies[i], p2 = amiga_frequencies[i + 1];

			if(octave > 0) {
				p1 >>= octave;
				p2 >>= octave;
			} else if(octave < 0) {
				p1 <<= (-octave);
				p2 <<= (-octave);
			}

			if(p2 <= period && period <= p1) {
				a = i;
				break;
			}
		}

		if(XM_DEBUG && (p1 < period || p2 > period)) {
			DEBUG("%" PRId32 " <= %f <= %" PRId32 " should hold but doesn't, this is a bug", p2, period, p1);
		}

		note = 12.f * (octave + 2) + a + XM_INVERSE_LERP(p1, p2, period);

		return xm_amiga_frequency(xm_amiga_period(note + note_offset) + 16.f * period_offset);

	}

	return .0f;
}